

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall
ON_LineCurve::Evaluate
          (ON_LineCurve *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_a8;
  int local_84;
  int di;
  double dt;
  ON_3dVector d;
  ON_3dPoint p;
  double s;
  bool rc;
  int *hint_local;
  double *pdStack_28;
  int side_local;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  double t_local;
  ON_LineCurve *this_local;
  
  s._7_1_ = false;
  dVar1 = ON_Interval::operator[](&this->m_t,0);
  dVar2 = ON_Interval::operator[](&this->m_t,1);
  if (dVar1 < dVar2) {
    dVar1 = ON_Interval::operator[](&this->m_t,1);
    if ((t != dVar1) || (NAN(t) || NAN(dVar1))) {
      dVar1 = ON_Interval::operator[](&this->m_t,0);
      dVar2 = ON_Interval::operator[](&this->m_t,1);
      dVar3 = ON_Interval::operator[](&this->m_t,0);
      local_a8 = (t - dVar1) / (dVar2 - dVar3);
    }
    else {
      local_a8 = 1.0;
    }
    ON_Line::PointAt((ON_3dPoint *)&d.z,&this->m_line,local_a8);
    *v = d.z;
    v[1] = p.x;
    if (this->m_dim == 3) {
      v[2] = p.y;
    }
    if (0 < der_count) {
      pdStack_28 = v + v_stride;
      ON_3dPoint::operator-((ON_3dVector *)&dt,&(this->m_line).to,&(this->m_line).from);
      dVar2 = ON_Interval::operator[](&this->m_t,1);
      dVar1 = ON_Interval::operator[](&this->m_t,0);
      dVar2 = dVar2 - dVar1;
      *pdStack_28 = dt / dVar2;
      pdStack_28[1] = d.x / dVar2;
      if (this->m_dim == 3) {
        pdStack_28[2] = d.y / dVar2;
      }
      for (local_84 = 2; local_84 <= der_count; local_84 = local_84 + 1) {
        pdStack_28 = pdStack_28 + v_stride;
        *pdStack_28 = 0.0;
        pdStack_28[1] = 0.0;
        if (this->m_dim == 3) {
          pdStack_28[2] = 0.0;
        }
      }
    }
    s._7_1_ = true;
  }
  return s._7_1_;
}

Assistant:

bool ON_LineCurve::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  bool rc = false;
  if ( m_t[0] < m_t[1] ) {
    double s = (t == m_t[1]) ? 1.0 : (t-m_t[0])/(m_t[1]-m_t[0]);
    const ON_3dPoint p = m_line.PointAt(s);
    v[0] = p.x;
    v[1] = p.y;
    if ( m_dim == 3 )
      v[2] = p.z;
    if ( der_count >= 1 ) 
    {
      v += v_stride;
      ON_3dVector d = m_line.to - m_line.from;
      double dt = m_t[1] - m_t[0];
      v[0] = d.x/dt;
      v[1] = d.y/dt;
      if ( m_dim == 3 )
        v[2] = d.z/dt;
      for ( int di = 2; di <= der_count; di++ ) {
        v += v_stride;
        v[0] = 0.0;
        v[1] = 0.0;
        if ( m_dim == 3 )
          v[2] = 0.0;
      }
    }
    rc = true;
  }
  return rc;
}